

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O2

float __thiscall
basisu::palette_index_reorderer::pick_side
          (palette_index_reorderer *this,uint32_t num_syms,uint32_t entry_to_move,
          pEntry_dist_func pDist_func,void *pCtx,float dist_func_weight)

{
  uint_vec *this_00;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong i;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  this_00 = &this->m_entries_picked;
  uVar1 = (this->m_entries_picked).m_size;
  fVar13 = 0.0;
  iVar9 = -1;
  i = 0;
  iVar7 = 0;
  iVar8 = 0;
  while (i < uVar1) {
    puVar6 = vector<unsigned_int>::operator[](this_00,i);
    uVar3 = get_hist(this,entry_to_move,*puVar6,num_syms);
    uVar1 = (this->m_entries_picked).m_size;
    iVar4 = uVar3 * (iVar9 + uVar1);
    i = i + 1;
    iVar5 = iVar4;
    iVar2 = 0;
    if ((int)(iVar9 + uVar1) < 0) {
      iVar5 = 0;
      iVar2 = iVar4;
    }
    fVar13 = fVar13 + (float)iVar4;
    iVar7 = iVar7 - iVar2;
    iVar8 = iVar8 + iVar5;
    iVar9 = iVar9 + -2;
  }
  if (pDist_func != (pEntry_dist_func)0x0) {
    fVar11 = 1.0 - dist_func_weight;
    puVar6 = vector<unsigned_int>::front(this_00);
    fVar13 = (*pDist_func)(entry_to_move,*puVar6,pCtx);
    fVar12 = (dist_func_weight + 1.0) - fVar11;
    puVar6 = vector<unsigned_int>::back(this_00);
    fVar10 = (*pDist_func)(entry_to_move,*puVar6,pCtx);
    fVar13 = (float)iVar8 * (fVar13 * fVar12 + fVar11) - (float)iVar7 * (fVar10 * fVar12 + fVar11);
  }
  return fVar13;
}

Assistant:

float palette_index_reorderer::pick_side(uint32_t num_syms, uint32_t entry_to_move, pEntry_dist_func pDist_func, void *pCtx, float dist_func_weight)
	{
		float which_side = 0;

		int l_count = 0, r_count = 0;
		for (uint32_t j = 0; j < m_entries_picked.size(); j++)
		{
			const int count = get_hist(entry_to_move, m_entries_picked[j], num_syms), r = ((int)m_entries_picked.size() + 1 - 2 * (j + 1));
			which_side += static_cast<float>(r * count);
			if (r >= 0)
				l_count += r * count;
			else
				r_count += -r * count;
		}

		if (pDist_func)
		{
			float w_left = lerp(1.0f - dist_func_weight, 1.0f + dist_func_weight, (*pDist_func)(entry_to_move, m_entries_picked.front(), pCtx));
			float w_right = lerp(1.0f - dist_func_weight, 1.0f + dist_func_weight, (*pDist_func)(entry_to_move, m_entries_picked.back(), pCtx));
			which_side = w_left * l_count - w_right * r_count;
		}
		return which_side;
	}